

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

size_t __thiscall VGMPlayer::DeviceID2OptionID(VGMPlayer *this,UINT32 id)

{
  size_type sVar1;
  const_reference pvVar2;
  byte local_1e;
  byte local_1d;
  UINT8 instance;
  UINT8 type;
  UINT32 id_local;
  VGMPlayer *this_local;
  
  if ((id & 0x80000000) == 0) {
    sVar1 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                      (&this->_devices);
    if (sVar1 <= id) {
      return 0xffffffffffffffff;
    }
    pvVar2 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
             operator[](&this->_devices,(ulong)id);
    local_1d = pvVar2->chipType;
    pvVar2 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
             operator[](&this->_devices,(ulong)id);
    local_1e = pvVar2->chipID;
  }
  else {
    local_1d = (byte)id;
    local_1e = (byte)(id >> 0x10);
  }
  if (local_1e < 2) {
    this_local = (VGMPlayer *)this->_devOptMap[local_1d][local_1e];
  }
  else {
    this_local = (VGMPlayer *)0xffffffffffffffff;
  }
  return (size_t)this_local;
}

Assistant:

size_t VGMPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devices.size())
	{
		type = _devices[id].chipType;
		instance = _devices[id].chipID;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (instance < 2)
		return _devOptMap[type][instance];
	else
		return (size_t)-1;
}